

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseUnboundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,ReferenceVars *type_vars)

{
  bool bVar1;
  Result RVar2;
  ReferenceVars *type_vars_local;
  TypeVector *types_local;
  TokenType token_local;
  WastParser *this_local;
  
  while( true ) {
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    RVar2 = ParseValueTypeList(this,types,type_vars);
    bVar1 = Failed(RVar2);
    if (bVar1) break;
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseUnboundValueTypeList(TokenType token,
                                             TypeVector* types,
                                             ReferenceVars* type_vars) {
  WABT_TRACE(ParseUnboundValueTypeList);
  while (MatchLpar(token)) {
    CHECK_RESULT(ParseValueTypeList(types, type_vars));
    EXPECT(Rpar);
  }
  return Result::Ok;
}